

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void findOrCreateAggInfoColumn(Parse *pParse,AggInfo *pAggInfo,Expr *pExpr)

{
  short sVar1;
  u16 uVar2;
  ExprList *pEVar3;
  Expr *pEVar4;
  int iVar5;
  AggInfo_col *pAVar6;
  ulong uVar7;
  ExprList_item *pEVar8;
  int iVar9;
  i16 *piVar10;
  u8 uVar11;
  int iVar12;
  long in_FS_OFFSET;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  iVar5 = pAggInfo->nColumn;
  if (pAggInfo->nColumn < 1) {
    iVar5 = 0;
  }
  piVar10 = &pAggInfo->aCol->iColumn;
  for (; iVar5 != (int)uVar7; uVar7 = (ulong)((int)uVar7 + 1)) {
    if (*(Expr **)(piVar10 + -6) == pExpr) goto LAB_00191e50;
    if (((*(int *)(piVar10 + -2) == pExpr->iTable) && (*piVar10 == pExpr->iColumn)) &&
       (uVar11 = pExpr->op, uVar11 != 0xb3)) goto LAB_00191e3f;
    piVar10 = piVar10 + 0xc;
  }
  local_24 = -0x55555556;
  pAVar6 = (AggInfo_col *)
           sqlite3ArrayAllocate(pParse->db,pAggInfo->aCol,0x18,&pAggInfo->nColumn,&local_24);
  pAggInfo->aCol = pAVar6;
  uVar7 = (ulong)local_24;
  if (-1 < (long)uVar7) {
    *(anon_union_8_3_c79b3df9_for_y *)(pAVar6 + uVar7) = pExpr->y;
    iVar5 = pExpr->iTable;
    pAVar6[uVar7].iTable = iVar5;
    sVar1 = pExpr->iColumn;
    pAVar6[uVar7].iColumn = sVar1;
    pAVar6[uVar7].pCExpr = pExpr;
    pEVar3 = pAggInfo->pGroupBy;
    if ((pEVar3 != (ExprList *)0x0) && (pExpr->op != 0xb3)) {
      iVar12 = pEVar3->nExpr;
      pEVar8 = pEVar3->a;
      iVar9 = 0;
      if (iVar12 < 1) {
        iVar12 = 0;
        iVar9 = 0;
      }
      for (; iVar12 != iVar9; iVar9 = iVar9 + 1) {
        pEVar4 = pEVar8->pExpr;
        if (((pEVar4->op == 0xa8) && (pEVar4->iTable == iVar5)) && (pEVar4->iColumn == sVar1)) {
          pAVar6[uVar7].iSorterColumn = (short)iVar9;
          if (-1 < (short)iVar9) goto LAB_00191e3c;
          break;
        }
        pEVar8 = pEVar8 + 1;
      }
    }
    uVar2 = pAggInfo->nSortingColumn;
    pAggInfo->nSortingColumn = uVar2 + 1;
    pAVar6[uVar7].iSorterColumn = uVar2;
LAB_00191e3c:
    uVar11 = pExpr->op;
LAB_00191e3f:
    pExpr->pAggInfo = pAggInfo;
    if (uVar11 == 0xa8) {
      pExpr->op = 0xaa;
    }
    pExpr->iAgg = (i16)uVar7;
  }
LAB_00191e50:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void findOrCreateAggInfoColumn(
  Parse *pParse,       /* Parsing context */
  AggInfo *pAggInfo,   /* The AggInfo object to search and/or modify */
  Expr *pExpr          /* Expr describing the column to find or insert */
){
  struct AggInfo_col *pCol;
  int k;

  assert( pAggInfo->iFirstReg==0 );
  pCol = pAggInfo->aCol;
  for(k=0; k<pAggInfo->nColumn; k++, pCol++){
    if( pCol->pCExpr==pExpr ) return;
    if( pCol->iTable==pExpr->iTable
     && pCol->iColumn==pExpr->iColumn
     && pExpr->op!=TK_IF_NULL_ROW
    ){
      goto fix_up_expr;
    }
  }
  k = addAggInfoColumn(pParse->db, pAggInfo);
  if( k<0 ){
    /* OOM on resize */
    assert( pParse->db->mallocFailed );
    return;
  }
  pCol = &pAggInfo->aCol[k];
  assert( ExprUseYTab(pExpr) );
  pCol->pTab = pExpr->y.pTab;
  pCol->iTable = pExpr->iTable;
  pCol->iColumn = pExpr->iColumn;
  pCol->iSorterColumn = -1;
  pCol->pCExpr = pExpr;
  if( pAggInfo->pGroupBy && pExpr->op!=TK_IF_NULL_ROW ){
    int j, n;
    ExprList *pGB = pAggInfo->pGroupBy;
    struct ExprList_item *pTerm = pGB->a;
    n = pGB->nExpr;
    for(j=0; j<n; j++, pTerm++){
      Expr *pE = pTerm->pExpr;
      if( pE->op==TK_COLUMN
       && pE->iTable==pExpr->iTable
       && pE->iColumn==pExpr->iColumn
      ){
        pCol->iSorterColumn = j;
        break;
      }
    }
  }
  if( pCol->iSorterColumn<0 ){
    pCol->iSorterColumn = pAggInfo->nSortingColumn++;
  }
fix_up_expr:
  ExprSetVVAProperty(pExpr, EP_NoReduce);
  assert( pExpr->pAggInfo==0 || pExpr->pAggInfo==pAggInfo );
  pExpr->pAggInfo = pAggInfo;
  if( pExpr->op==TK_COLUMN ){
    pExpr->op = TK_AGG_COLUMN;
  }
  pExpr->iAgg = (i16)k;
}